

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensor.cpp
# Opt level: O1

void __thiscall Sensor::Sensor(Sensor *this,string *name,VectorXd *noise,int df,int debug)

{
  pointer pcVar1;
  
  this->_vptr_Sensor = (_func_int **)&PTR__Sensor_0014fc40;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + name->_M_string_length);
  this->df_ = df;
  this->debug_ = debug;
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  SetR(this,noise);
  return;
}

Assistant:

Sensor::Sensor(string name, const VectorXd& noise, int df, int debug) :
	name_(name),
	df_(df),
	debug_(debug)
{
    SetR(noise);
}